

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_icu.cpp
# Opt level: O0

bool qt_u_strToCase(QString *str,QString *out,char *localeID,Ptr_u_strToCase caseFunc)

{
  UBool UVar1;
  int iVar2;
  undefined4 uVar3;
  QChar *pQVar4;
  ulong uVar5;
  QChar *pQVar6;
  qsizetype qVar7;
  code *in_RCX;
  undefined8 in_RDX;
  QString *in_RDI;
  long in_FS_OFFSET;
  int32_t size;
  UErrorCode status;
  QString result;
  QString *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  Initialization in_stack_ffffffffffffff3c;
  qsizetype in_stack_ffffffffffffff40;
  QString *in_stack_ffffffffffffff48;
  bool local_2d;
  UErrorCode local_2c;
  QString local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QString::size(in_RDI);
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  local_2c = U_ZERO_ERROR;
  pQVar4 = QString::data((QString *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  uVar5 = QString::size(&local_28);
  pQVar6 = QString::constData((QString *)0x72ba05);
  qVar7 = QString::size(in_RDI);
  iVar2 = (*in_RCX)(pQVar4,uVar5 & 0xffffffff,pQVar6,qVar7,in_RDX,&local_2c);
  UVar1 = U_FAILURE(local_2c);
  if ((UVar1 != '\0') && (local_2c != U_BUFFER_OVERFLOW_ERROR)) {
    local_2d = false;
    goto LAB_0072bc6b;
  }
  qVar7 = QString::size(&local_28);
  if (iVar2 < qVar7) {
    QString::resize((QString *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                    (qsizetype)in_stack_ffffffffffffff18);
  }
  else {
    qVar7 = QString::size(&local_28);
    if (qVar7 < iVar2) {
      QString::resize((QString *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                      (qsizetype)in_stack_ffffffffffffff18);
      local_2c = U_ZERO_ERROR;
      pQVar4 = QString::data((QString *)
                             CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      qVar7 = QString::size(&local_28);
      uVar3 = (undefined4)qVar7;
      pQVar6 = QString::constData((QString *)0x72bb87);
      qVar7 = QString::size(in_RDI);
      iVar2 = (*in_RCX)(pQVar4,uVar3,pQVar6,qVar7,in_RDX,&local_2c);
      UVar1 = U_FAILURE(local_2c);
      if (UVar1 != '\0') {
        local_2d = false;
        goto LAB_0072bc6b;
      }
      qVar7 = QString::size(&local_28);
      if (iVar2 != qVar7) {
        local_2d = false;
        goto LAB_0072bc6b;
      }
    }
  }
  QString::operator=((QString *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                     in_stack_ffffffffffffff18);
  local_2d = true;
LAB_0072bc6b:
  QString::~QString((QString *)0x72bc78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_2d;
}

Assistant:

static bool qt_u_strToCase(const QString &str, QString *out, const char *localeID, Ptr_u_strToCase caseFunc)
{
    Q_ASSERT(out);

    int32_t size = str.size();
    size += size >> 2; // add 25% for possible expansions
    QString result(size, Qt::Uninitialized);

    UErrorCode status = U_ZERO_ERROR;

    size = caseFunc(reinterpret_cast<UChar *>(result.data()), result.size(),
            reinterpret_cast<const UChar *>(str.constData()), str.size(),
            localeID, &status);

    if (U_FAILURE(status) && status != U_BUFFER_OVERFLOW_ERROR)
        return false;

    if (size < result.size()) {
        result.resize(size);
    } else if (size > result.size()) {
        // the resulting string is larger than our source string
        result.resize(size);

        status = U_ZERO_ERROR;
        size = caseFunc(reinterpret_cast<UChar *>(result.data()), result.size(),
            reinterpret_cast<const UChar *>(str.constData()), str.size(),
            localeID, &status);

        if (U_FAILURE(status))
            return false;

        // if the sizes don't match now, we give up.
        if (size != result.size())
            return false;
    }

    *out = result;
    return true;
}